

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O0

void license::initializeProject
               (parsed_options *parsed,variables_map *vm,char **argv,options_description *global)

{
  bool bVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  options_description_easy_init *poVar3;
  typed_value<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *ptVar4;
  undefined1 local_278 [8];
  Project project;
  string local_208;
  allocator local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  allocator local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined8 local_198;
  undefined1 local_190 [8];
  string templates_folder;
  string project_folder;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  public_key;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  primary_key;
  string project_name;
  allocator local_c9;
  string local_c8 [32];
  options_description local_a8 [8];
  options_description project_desc;
  options_description *global_local;
  char **argv_local;
  variables_map *vm_local;
  parsed_options *parsed_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"project init options",&local_c9);
  boost::program_options::options_description::options_description(local_a8,local_c8,0x50,0x28);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::string((string *)(primary_key.super_type.m_storage.dummy_.data + 0x18));
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&public_key.super_type.m_storage.dummy_ + 0x18));
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&project_folder.field_2 + 8));
  std::__cxx11::string::string((string *)(templates_folder.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_190);
  local_198 = boost::program_options::options_description::add_options(local_a8);
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&primary_key.super_type.m_storage.dummy_ + 0x18));
  ptVar2 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar2);
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&local_198,"project-name,n",
                      (value_semantic *)ptVar2,"New project name (required).");
  ptVar4 = boost::program_options::value<boost::optional<std::__cxx11::string>>
                     ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)&public_key.super_type.m_storage.dummy_ + 0x18));
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"primary-key",(value_semantic *)ptVar4,
                      "use externally generated primary key, public key must also be specified.");
  ptVar4 = boost::program_options::value<boost::optional<std::__cxx11::string>>
                     ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((long)&project_folder.field_2 + 8));
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"public-key",(value_semantic *)ptVar4,
                      "Use externally generated public key, private key must also be specified.");
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&templates_folder.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,".",&local_1b9);
  ptVar2 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar2,&local_1b8);
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"projects-folder,p",(value_semantic *)ptVar2,
                      "path to where all the projects configurations are stored.");
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190
                     );
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,".",&local_1e1);
  ptVar2 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar2,&local_1e0);
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"templates,t",(value_semantic *)ptVar2,"path to the templates folder.")
  ;
  boost::program_options::options_description_easy_init::operator()
            (poVar3,"help","Print this help.");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"project init",(allocator *)&project.field_0x67)
  ;
  bVar1 = rerunBoostPO(parsed,local_a8,vm,argv,&local_208,global);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&project.field_0x67);
  if (bVar1) {
    Project::Project((Project *)local_278,
                     (string *)((long)&primary_key.super_type.m_storage.dummy_ + 0x18),
                     (string *)((long)&templates_folder.field_2 + 8),(string *)local_190,false);
    Project::initialize((Project *)local_278);
    Project::~Project((Project *)local_278);
  }
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)(templates_folder.field_2._M_local_buf + 8));
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&project_folder.field_2 + 8));
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&public_key.super_type.m_storage.dummy_ + 0x18));
  std::__cxx11::string::~string((string *)(primary_key.super_type.m_storage.dummy_.data + 0x18));
  boost::program_options::options_description::~options_description(local_a8);
  return;
}

Assistant:

static void initializeProject(const po::parsed_options &parsed, po::variables_map &vm, const char **argv,
							  const po::options_description &global) {
	po::options_description project_desc("project init options");
	std::string project_name;
	boost::optional<std::string> primary_key;
	boost::optional<std::string> public_key;
	std::string project_folder;
	std::string templates_folder;
	project_desc.add_options()  //
		("project-name,n", po::value<std::string>(&project_name)->required(), "New project name (required).")  //
		(PARAM_PRIMARY_KEY, po::value<boost::optional<std::string>>(&primary_key),
		 "use externally generated primary key, public key must also be specified.")  //
		("public-key", po::value<boost::optional<std::string>>(&public_key),
		 "Use externally generated public key, private key must also be specified.")  //
		("projects-folder,p", po::value<std::string>(&project_folder)->default_value("."),  //
		 "path to where all the projects configurations are stored.")  //
		("templates,t", po::value<std::string>(&templates_folder)->default_value("."),
		 "path to the templates folder.")  //
		("help", "Print this help.");  //
	if (rerunBoostPO(parsed, project_desc, vm, argv, "project init", global)) {
		// cout << templates_folder.is_initialized() << endl;
		Project project(project_name, project_folder, templates_folder);
		project.initialize();
	}
}